

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptNativeIntArray::JavascriptNativeIntArray
          (JavascriptNativeIntArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  
  JavascriptNativeArray::JavascriptNativeArray(&this->super_JavascriptNativeArray,type);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01393f28;
  pSVar1 = &JavascriptArray::
            DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,false>(this)->
            super_SparseArraySegmentBase;
  JavascriptArray::SetHeadAndLastUsedSegment((JavascriptArray *)this,pSVar1);
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  pSVar1->size = size;
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  SparseArraySegment<int>::FillSegmentBuffer
            ((SparseArraySegment<int> *)
             (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr,0,size);
  return;
}

Assistant:

JavascriptNativeIntArray::JavascriptNativeIntArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeIntArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<int32>::From(head)->FillSegmentBuffer(0, size);
    }